

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__declare
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  long lVar1;
  bool bVar2;
  declare__AttributeData *pdVar3;
  StringHash SVar4;
  uint64 uVar5;
  long lVar6;
  xmlChar **ppxVar7;
  bool failed_1;
  ParserChar *attributeValue;
  URI *local_120;
  bool failed;
  
  pdVar3 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::declare__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar7 = attributes->attributes;
  if (ppxVar7 != (xmlChar **)0x0) {
    local_120 = &pdVar3->definitionURL;
    for (; text = *ppxVar7, text != (ParserChar *)0x0; ppxVar7 = ppxVar7 + 2) {
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      attributeValue = ppxVar7[1];
      if (SVar4 == 0xc9ffd35) {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(attributeValue,&failed);
        lVar1 = 0;
        do {
          lVar6 = lVar1;
          if (lVar6 + 0x10 == 0x40) {
            failed = true;
            pdVar3->occurrence = ENUM__mathml__declare__occurrence__COUNT;
            bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0xc9ffd35,attributeValue);
            goto LAB_00788b54;
          }
          lVar1 = lVar6 + 0x10;
        } while (*(StringHash *)((long)&ENUM__mathml__declare__occurrenceMap + lVar6) != SVar4);
        pdVar3->occurrence = *(ENUM__mathml__declare__occurrence *)((long)&DAT_00869518 + lVar6);
      }
      else if (SVar4 == 0x593f0c) {
        GeneratedSaxParser::Utils::toURI((URI *)&failed,&attributeValue,&failed_1);
        COLLADABU::URI::operator=(local_120,(URI *)&failed);
        COLLADABU::URI::~URI((URI *)&failed);
        if ((failed_1 == true) &&
           (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0x593f0c,attributeValue),
           bVar2)) {
          return false;
        }
        if ((failed_1 & 1U) == 0) {
          *(byte *)&pdVar3->present_attributes = (byte)pdVar3->present_attributes | 2;
        }
      }
      else if (SVar4 == 0x7488e3) {
        uVar5 = GeneratedSaxParser::Utils::toUint64(attributeValue,&failed);
        pdVar3->nargs = uVar5;
        if ((failed == true) &&
           (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0xaba28e5,0x7488e3,attributeValue),
           bVar2)) {
          return false;
        }
        if ((failed & 1U) == 0) {
          *(byte *)&pdVar3->present_attributes = (byte)pdVar3->present_attributes | 1;
        }
      }
      else if (SVar4 == 0x79a665) {
        pdVar3->scope = attributeValue;
      }
      else if (SVar4 == 0x4a5aa87) {
        pdVar3->encoding = attributeValue;
      }
      else if (SVar4 == 0x7c065) {
        pdVar3->type = attributeValue;
      }
      else {
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0xaba28e5,text,attributeValue);
LAB_00788b54:
        if (bVar2 != false) {
          return false;
        }
      }
    }
  }
  if ((pdVar3->present_attributes & 2) == 0) {
    COLLADABU::URI::URI((URI *)&failed,"");
    COLLADABU::URI::operator=(&pdVar3->definitionURL,(URI *)&failed);
    COLLADABU::URI::~URI((URI *)&failed);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__declare( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__declare( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

declare__AttributeData* attributeData = newData<declare__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_SCOPE:
    {

attributeData->scope = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NARGS:
    {
bool failed;
attributeData->nargs = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_NARGS,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= declare__AttributeData::ATTRIBUTE_NARGS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_OCCURRENCE:
    {
bool failed;
attributeData->occurrence = Utils::toEnum<ENUM__mathml__declare__occurrence, StringHash, ENUM__mathml__declare__occurrence__COUNT>(attributeValue, failed, ENUM__mathml__declare__occurrenceMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_OCCURRENCE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_ENCODING:
    {

attributeData->encoding = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_DEFINITIONURL:
    {
bool failed;
attributeData->definitionURL = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_DECLARE,
        HASH_ATTRIBUTE_DEFINITIONURL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= declare__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_DECLARE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & declare__AttributeData::ATTRIBUTE_DEFINITIONURL_PRESENT) == 0)
{
    attributeData->definitionURL = COLLADABU::URI("");
}


    return true;
}